

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_table_base.hpp
# Opt level: O1

Coroutine * __thiscall
squall::TableBase::co_call<>(Coroutine *__return_storage_ptr__,TableBase *this,string *name)

{
  HSQUIRRELVM v;
  SQInteger SVar1;
  
  SVar1 = sq_gettop(this->vm_);
  detail::call_setup<>(this->vm_,&this->tableobj_,name);
  v = this->vm_;
  __return_storage_ptr__->vm_ = v;
  __return_storage_ptr__->top_ = SVar1;
  SVar1 = sq_getvmstate(v);
  __return_storage_ptr__->suspended_ = SVar1 == 2;
  return __return_storage_ptr__;
}

Assistant:

Coroutine co_call(const string& name, T... args) {
        SQInteger top = sq_gettop(handle());
        detail::call_setup(vm_, tableobj_, name, args...);
        return Coroutine(vm_, top);
    }